

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_map.h
# Opt level: O1

void __thiscall cppcms::impl::string_pool::add_page(string_pool *this)

{
  long lVar1;
  undefined8 *puVar2;
  
  lVar1 = *(long *)this;
  puVar2 = (undefined8 *)malloc(lVar1 + 0x10);
  if (puVar2 != (undefined8 *)0x0) {
    *puVar2 = *(undefined8 *)(this + 8);
    *(undefined8 **)(this + 8) = puVar2;
    *(undefined8 **)(this + 0x18) = puVar2 + 1;
    *(long *)(this + 0x10) = lVar1;
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = std::__throw_bad_array_new_length;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

void add_page()
			{
				page *p=(page *)malloc(sizeof(page) + page_size_);
				if(!p)
					throw std::bad_alloc();
				p->next = pages_;
				pages_ = p;
				data_ = p->data;
				free_space_ = page_size_;
			}